

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

ENetPacket * enet_packet_create(void *data,size_t dataLength,enet_uint32 flags)

{
  enet_uint8 *peVar1;
  uint in_EDX;
  size_t in_RSI;
  enet_uint8 *in_RDI;
  ENetPacket *packet;
  undefined4 in_stack_ffffffffffffffe0;
  ENetPacket *local_8;
  
  local_8 = (ENetPacket *)enet_malloc(CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
  if (local_8 == (ENetPacket *)0x0) {
    local_8 = (ENetPacket *)0x0;
  }
  else {
    if ((in_EDX & 4) == 0) {
      if (in_RSI == 0) {
        local_8->data = (enet_uint8 *)0x0;
      }
      else {
        peVar1 = (enet_uint8 *)enet_malloc(CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
        local_8->data = peVar1;
        if (local_8->data == (enet_uint8 *)0x0) {
          enet_free((void *)0x1062af);
          return (ENetPacket *)0x0;
        }
        if (in_RDI != (enet_uint8 *)0x0) {
          memcpy(local_8->data,in_RDI,in_RSI);
        }
      }
    }
    else {
      local_8->data = in_RDI;
    }
    local_8->referenceCount = 0;
    local_8->flags = in_EDX;
    local_8->dataLength = in_RSI;
    local_8->freeCallback = (ENetPacketFreeCallback)0x0;
    local_8->userData = (void *)0x0;
  }
  return local_8;
}

Assistant:

ENetPacket *
enet_packet_create (const void * data, size_t dataLength, enet_uint32 flags)
{
    ENetPacket * packet = (ENetPacket *) enet_malloc (sizeof (ENetPacket));
    if (packet == NULL)
      return NULL;

    if (flags & ENET_PACKET_FLAG_NO_ALLOCATE)
      packet -> data = (enet_uint8 *) data;
    else
    if (dataLength <= 0)
      packet -> data = NULL;
    else
    {
       packet -> data = (enet_uint8 *) enet_malloc (dataLength);
       if (packet -> data == NULL)
       {
          enet_free (packet);
          return NULL;
       }

       if (data != NULL)
         memcpy (packet -> data, data, dataLength);
    }

    packet -> referenceCount = 0;
    packet -> flags = flags;
    packet -> dataLength = dataLength;
    packet -> freeCallback = NULL;
    packet -> userData = NULL;

    return packet;
}